

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_hex_to_byte_array(char *h,uint8_t *dest,int max)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  byte bVar5;
  byte bVar6;
  
  iVar3 = (int)dest;
  while (max != 0) {
    cVar1 = *h;
    if (cVar1 == '\0') goto LAB_0010f271;
    bVar5 = cVar1 - 0x30;
    if (9 < bVar5) {
      if ((byte)(cVar1 + 0x9fU) < 6) {
        bVar5 = cVar1 + 0xa9;
      }
      else {
        bVar5 = cVar1 - 0x37;
        if (5 < (byte)(cVar1 + 0xbfU)) {
          bVar5 = 0xff;
        }
      }
    }
    pcVar4 = h + 1;
    cVar1 = *pcVar4;
    bVar2 = false;
    if ((cVar1 != '\0') && (-1 < (char)bVar5)) {
      bVar6 = cVar1 - 0x30;
      if (9 < bVar6) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar6 = cVar1 + 0xa9;
        }
        else {
          bVar6 = cVar1 - 0x37;
          if (5 < (byte)(cVar1 + 0xbfU)) {
            bVar6 = 0xff;
          }
        }
      }
      pcVar4 = h + 2;
      if ((char)bVar6 < '\0') {
        bVar2 = false;
      }
      else {
        *dest = bVar6 | bVar5 << 4;
        dest = dest + 1;
        bVar2 = true;
      }
    }
    h = pcVar4;
    max = max + -1;
    if (!bVar2) {
      return -1;
    }
  }
  max = 0;
LAB_0010f271:
  if (max < 1) {
    return -1;
  }
  return (int)dest - iVar3;
}

Assistant:

int
lws_hex_to_byte_array(const char *h, uint8_t *dest, int max)
{
	uint8_t *odest = dest;

	while (max-- && *h) {
		int t = char_to_hex(*h++), t1;

		if (!*h || t < 0)
			return -1;

		t1 = char_to_hex(*h++);
		if (t1 < 0)
			return -1;

		*dest++ = (t << 4) | t1;
	}

	if (max < 0)
		return -1;

	return lws_ptr_diff(dest, odest);
}